

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpicture.cpp
# Opt level: O2

bool __thiscall QPicture::load(QPicture *this,QIODevice *dev)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QExplicitlySharedDataPointer<QPicturePrivate>::detach(&this->d_ptr);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QIODevice::readAll();
  QBuffer::setData((QByteArray *)&((this->d_ptr).d.ptr)->pictb);
  bVar1 = QPicturePrivate::checkFormat((this->d_ptr).d.ptr);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QPicture::load(QIODevice *dev)
{
    detach();
    QByteArray a = dev->readAll();

    d_func()->pictb.setData(a);                        // set byte array in buffer
    return d_func()->checkFormat();
}